

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
* __thiscall
llvm::optional_detail::
OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::operator=(OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  if (this->hasVal == true) {
    std::__cxx11::string::operator=((string *)this,(string *)y);
  }
  else {
    pcVar1 = (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10;
    *(char **)(this->storage).super_AlignedCharArray<8UL,_32UL>.buffer = pcVar1;
    pcVar3 = (y->_M_dataplus)._M_p;
    paVar2 = &y->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar2) {
      uVar4 = *(undefined8 *)((long)&y->field_2 + 8);
      *(size_type *)pcVar1 = paVar2->_M_allocated_capacity;
      *(undefined8 *)((this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x18) = uVar4;
    }
    else {
      *(pointer *)(this->storage).super_AlignedCharArray<8UL,_32UL>.buffer = pcVar3;
      *(size_type *)((this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10) =
           paVar2->_M_allocated_capacity;
    }
    *(size_type *)((this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 8) =
         y->_M_string_length;
    (y->_M_dataplus)._M_p = (pointer)paVar2;
    y->_M_string_length = 0;
    (y->field_2)._M_local_buf[0] = '\0';
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasVal)
      *getPointer() = std::move(y);
    else {
      new (storage.buffer) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }